

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

int get_bool_option(JSContext *ctx,BOOL *pbool,JSValue obj,char *option)

{
  int iVar1;
  JSValue val;
  
  val = JS_GetPropertyStr(ctx,obj,option);
  if ((int)val.tag != 3) {
    if ((int)val.tag == 6) {
      return -1;
    }
    iVar1 = JS_ToBool(ctx,val);
    *pbool = iVar1;
  }
  JS_FreeValue(ctx,val);
  return 0;
}

Assistant:

static int get_bool_option(JSContext *ctx, BOOL *pbool,
                           JSValueConst obj,
                           const char *option)
{
    JSValue val;
    val = JS_GetPropertyStr(ctx, obj, option);
    if (JS_IsException(val))
        return -1;
    if (!JS_IsUndefined(val)) {
        *pbool = JS_ToBool(ctx, val);
    }
    JS_FreeValue(ctx, val);
    return 0;
}